

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

void fasttext::averageRowsFast<64u>
               (Vector *x,vector<int,_std::allocator<int>_> *rows,DenseMatrix *matrix)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  float *pfVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  int *piVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_XMM4 [16];
  Register accum [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  auVar15 = in_ZMM0._0_16_;
  if (((ulong)(x->data_).mem_ & 0x3f) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(x.data()) % sizeof(Register) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0xb3,
                  "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 64U]"
                 );
  }
  pfVar6 = (matrix->data_).mem_;
  if (((ulong)pfVar6 & 0x3f) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(matrix.data()) % sizeof(Register) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0xb4,
                  "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 64U]"
                 );
  }
  piVar7 = (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar8 = (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar7 == piVar8) {
    Vector::zero(x);
    auVar15 = vcvtusi2sd_avx512f(auVar15,(long)(rows->super__Vector_base<int,_std::allocator<int>_>)
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(rows->super__Vector_base<int,_std::allocator<int>_>)
                                               ._M_impl.super__Vector_impl_data._M_start >> 2);
    Vector::mul(x,(float)(1.0 / auVar15._0_8_));
  }
  else {
    lVar9 = (matrix->super_Matrix).n_;
    lVar10 = *piVar7 * lVar9;
    pfVar1 = pfVar6 + lVar10;
    pfVar2 = pfVar6 + lVar10 + 0x10;
    pfVar3 = pfVar6 + lVar10 + 0x20;
    pfVar4 = pfVar6 + lVar10 + 0x30;
    local_c0 = *(undefined8 *)pfVar4;
    uStack_b8 = *(undefined8 *)(pfVar4 + 2);
    uStack_b0 = *(undefined8 *)(pfVar4 + 4);
    uStack_a8 = *(undefined8 *)(pfVar4 + 6);
    uStack_a0 = *(undefined8 *)(pfVar4 + 8);
    uStack_98 = *(undefined8 *)(pfVar4 + 10);
    uStack_90 = *(undefined8 *)(pfVar4 + 0xc);
    uStack_88 = *(undefined8 *)(pfVar4 + 0xe);
    local_100 = *(undefined8 *)pfVar3;
    uStack_f8 = *(undefined8 *)(pfVar3 + 2);
    uStack_f0 = *(undefined8 *)(pfVar3 + 4);
    uStack_e8 = *(undefined8 *)(pfVar3 + 6);
    uStack_e0 = *(undefined8 *)(pfVar3 + 8);
    uStack_d8 = *(undefined8 *)(pfVar3 + 10);
    uStack_d0 = *(undefined8 *)(pfVar3 + 0xc);
    uStack_c8 = *(undefined8 *)(pfVar3 + 0xe);
    local_140 = *(undefined8 *)pfVar2;
    uStack_138 = *(undefined8 *)(pfVar2 + 2);
    uStack_130 = *(undefined8 *)(pfVar2 + 4);
    uStack_128 = *(undefined8 *)(pfVar2 + 6);
    uStack_120 = *(undefined8 *)(pfVar2 + 8);
    uStack_118 = *(undefined8 *)(pfVar2 + 10);
    uStack_110 = *(undefined8 *)(pfVar2 + 0xc);
    uStack_108 = *(undefined8 *)(pfVar2 + 0xe);
    local_180 = *(undefined8 *)pfVar1;
    uStack_178 = *(undefined8 *)(pfVar1 + 2);
    uStack_170 = *(undefined8 *)(pfVar1 + 4);
    uStack_168 = *(undefined8 *)(pfVar1 + 6);
    uStack_160 = *(undefined8 *)(pfVar1 + 8);
    uStack_158 = *(undefined8 *)(pfVar1 + 10);
    uStack_150 = *(undefined8 *)(pfVar1 + 0xc);
    uStack_148 = *(undefined8 *)(pfVar1 + 0xe);
    piVar11 = piVar7;
    while (piVar11 = piVar11 + 1, piVar11 != piVar8) {
      iVar5 = *piVar11;
      lVar10 = 0;
      do {
        auVar12 = vaddps_avx512f(*(undefined1 (*) [64])((long)&local_180 + lVar10),
                                 *(undefined1 (*) [64])((long)pfVar6 + lVar10 + iVar5 * lVar9 * 4));
        *(undefined1 (*) [64])((long)&local_180 + lVar10) = auVar12;
        lVar10 = lVar10 + 0x40;
      } while (lVar10 != 0x100);
    }
    lVar9 = 0;
    auVar15 = vcvtusi2sd_avx512f(in_XMM4,(long)piVar8 - (long)piVar7 >> 2);
    dVar14 = 1.0 / auVar15._0_8_;
    auVar15._0_4_ = (float)dVar14;
    auVar15._4_4_ = (int)((ulong)dVar14 >> 0x20);
    auVar15._8_8_ = 0;
    auVar12 = vbroadcastss_avx512f(auVar15);
    do {
      auVar13 = vmulps_avx512f(auVar12,*(undefined1 (*) [64])((long)&local_180 + lVar9));
      *(undefined1 (*) [64])((long)(x->data_).mem_ + lVar9) = auVar13;
      lVar9 = lVar9 + 0x40;
    } while (lVar9 != 0x100);
  }
  return;
}

Assistant:

void averageRowsFast(Vector& x, const std::vector<int32_t>& rows, const DenseMatrix &matrix) {
  // Columns must be a multiple of how many floats fit in a register.
  static_assert(Cols % (sizeof(Register) / 4) == 0);
  constexpr unsigned RegisterCount = Cols / (sizeof(Register) / 4);
  // These should be aligned by aligned.h
  assert(reinterpret_cast<uintptr_t>(x.data()) % sizeof(Register) == 0);
  assert(reinterpret_cast<uintptr_t>(matrix.data()) % sizeof(Register) == 0);

  // Guard against empty list of rows with default NaN behavior.
  if (rows.empty()) {
    x.zero();
    x.mul(1.0 / rows.size());
    return;
  }

  // Copy the first row to accumulation registers.
  Register accum[RegisterCount];
  auto row = rows.cbegin();
  const Register *base = reinterpret_cast<const Register*>(matrix.data() + matrix.cols() * *row);
  for (unsigned i = 0; i < RegisterCount; ++i) {
    accum[i] = base[i];
  }
  // Add the rows after the first.
  for (++row; row != rows.cend(); ++row) {
    base = reinterpret_cast<const Register*>(matrix.data() + matrix.cols() * *row);
    for (unsigned i = 0; i < RegisterCount; ++i) {
      accum[i] = Add(accum[i], base[i]);
    }
  }
  // Multiply by (1.0 / rows.size()) and write to x.
  Register mul = Set1(1.0 / rows.size());
  for (unsigned i = 0; i < RegisterCount; ++i) {
    reinterpret_cast<Register*>(x.data())[i] = Multiply(accum[i], mul);
  }
}